

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMagic.cpp
# Opt level: O1

void anon_unknown.dwarf_1d8dcc::testFile2(char *fileName,bool exists,bool exrFile,bool tiledFile)

{
  char cVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  bool tiled;
  StdIFStream is;
  bool local_61;
  StdIFStream local_60 [56];
  
  if (fileName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ecfa0);
  }
  else {
    sVar2 = strlen(fileName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,fileName,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::ostream::flush();
  cVar1 = Imf_3_4::isOpenExrFile(fileName,&local_61);
  if (((bool)cVar1 != exrFile) || (local_61 != tiledFile)) {
    __assert_fail("exr == exrFile && tiled == tiledFile",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                  ,0x37,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
  }
  cVar1 = Imf_3_4::isOpenExrFile(fileName);
  if ((bool)cVar1 != exrFile) {
    __assert_fail("exr == exrFile",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                  ,0x3a,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
  }
  local_61 = (bool)Imf_3_4::isTiledOpenExrFile(fileName);
  if (local_61 == tiledFile) {
    if (exists) {
      Imf_3_4::StdIFStream::StdIFStream(local_60,fileName);
      cVar1 = Imf_3_4::isOpenExrFile((IStream *)local_60,&local_61);
      if (((bool)cVar1 != exrFile) || (local_61 != tiledFile)) {
        __assert_fail("exr == exrFile && tiled == tiledFile",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                      ,0x44,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)")
        ;
      }
      if (cVar1 != '\0') {
        lVar3 = Imf_3_4::StdIFStream::tellg();
        if (lVar3 != 0) {
          __assert_fail("is.tellg () == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                        ,0x46,
                        "void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
        }
      }
      cVar1 = Imf_3_4::isOpenExrFile((IStream *)local_60);
      if ((bool)cVar1 != exrFile) {
        __assert_fail("exr == exrFile",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                      ,0x49,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)")
        ;
      }
      if (cVar1 != '\0') {
        lVar3 = Imf_3_4::StdIFStream::tellg();
        if (lVar3 != 0) {
          __assert_fail("is.tellg () == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                        ,0x4b,
                        "void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
        }
      }
      local_61 = (bool)Imf_3_4::isTiledOpenExrFile((IStream *)local_60);
      if (local_61 != tiledFile) {
        __assert_fail("tiled == tiledFile",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                      ,0x4e,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)")
        ;
      }
      if (local_61 != false) {
        lVar3 = Imf_3_4::StdIFStream::tellg();
        if (lVar3 != 0) {
          __assert_fail("is.tellg () == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                        ,0x50,
                        "void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
        }
      }
      Imf_3_4::StdIFStream::~StdIFStream(local_60);
      pcVar4 = "exists";
    }
    else {
      pcVar4 = "does not exist";
    }
    sVar2 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    pcVar4 = "is not an OpenEXR file";
    if (exrFile) {
      pcVar4 = "is an OpenEXR file";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pcVar4,(ulong)!exrFile * 4 + 0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    pcVar4 = "is not tiled";
    if (tiledFile) {
      pcVar4 = "is tiled";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pcVar4,(ulong)!tiledFile * 4 + 8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    return;
  }
  __assert_fail("tiled == tiledFile",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                ,0x3d,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
}

Assistant:

void
testFile2 (const char fileName[], bool exists, bool exrFile, bool tiledFile)
{
    cout << fileName << " " << flush;

    bool exr, tiled;

    exr = isOpenExrFile (fileName, tiled);
    assert (exr == exrFile && tiled == tiledFile);

    exr = isOpenExrFile (fileName);
    assert (exr == exrFile);

    tiled = isTiledOpenExrFile (fileName);
    assert (tiled == tiledFile);

    if (exists)
    {
        StdIFStream is (fileName);

        exr = isOpenExrFile (is, tiled);
        assert (exr == exrFile && tiled == tiledFile);

        if (exr) assert (is.tellg () == 0);

        exr = isOpenExrFile (is);
        assert (exr == exrFile);

        if (exr) assert (is.tellg () == 0);

        tiled = isTiledOpenExrFile (is);
        assert (tiled == tiledFile);

        if (tiled) assert (is.tellg () == 0);
    }

    cout << (exists ? "exists" : "does not exist") << ", "
         << (exrFile ? "is an OpenEXR file" : "is not an OpenEXR file") << ", "
         << (tiledFile ? "is tiled" : "is not tiled") << endl;
}